

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float64 float64_mul_arm(float64 a,float64 b,float_status *s)

{
  _Bool _Var1;
  double dVar2;
  float64 fVar3;
  union_float64 ub;
  union_float64 ua;
  union_float64 local_30;
  union_float64 local_28;
  
  local_30.s = b;
  local_28.s = a;
  if (((s->float_exception_flags & 0x20) != 0) && (s->float_rounding_mode == '\0')) {
    float64_input_flush2(&local_28.s,&local_30.s,s);
    a = local_28.s;
    b = local_30.s;
    _Var1 = f64_is_zon2(local_28,local_30);
    if (_Var1) {
      if ((b & 0x7fffffffffffffff) == 0 || (a & 0x7fffffffffffffff) == 0) {
        dVar2 = (double)((b ^ a) & 0x8000000000000000);
      }
      else {
        dVar2 = (double)b * (double)a;
        if (ABS(dVar2) == INFINITY) {
          s->float_exception_flags = s->float_exception_flags | 8;
        }
        else if (ABS(dVar2) <= 2.2250738585072014e-308) goto LAB_00505060;
      }
      return (float64)dVar2;
    }
  }
LAB_00505060:
  fVar3 = soft_f64_mul(a,b,s);
  return fVar3;
}

Assistant:

float64 QEMU_FLATTEN
float64_mul(float64 a, float64 b, float_status *s)
{
    return float64_gen2(a, b, s, hard_f64_mul, soft_f64_mul,
                        f64_is_zon2, NULL, f64_mul_fast_test, f64_mul_fast_op);
}